

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O2

void prune_intra_mode_with_hog
               (MACROBLOCK *x,BLOCK_SIZE bsize,BLOCK_SIZE sb_size,float th,
               uint8_t *directional_mode_skip_mask,int is_chroma)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  int i;
  int iVar7;
  float *pfVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar16;
  long lVar17;
  int ss_x;
  uint8_t *puVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  undefined7 in_register_00000031;
  int iVar23;
  PixelLevelGradientInfo *pPVar24;
  long lVar25;
  int c;
  long lVar26;
  uint8_t *puVar27;
  int ss_y;
  int iVar28;
  uint8_t *puVar29;
  long lVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float hist [32];
  float scores [8];
  int iVar15;
  long lVar18;
  
  bVar31 = is_chroma != 0;
  hist[0x1c] = 0.0;
  hist[0x1d] = 0.0;
  hist[0x1e] = 0.0;
  hist[0x1f] = 0.0;
  hist[0x18] = 0.0;
  hist[0x19] = 0.0;
  hist[0x1a] = 0.0;
  hist[0x1b] = 0.0;
  hist[0x14] = 0.0;
  hist[0x15] = 0.0;
  hist[0x16] = 0.0;
  hist[0x17] = 0.0;
  hist[0x10] = 0.0;
  hist[0x11] = 0.0;
  hist[0x12] = 0.0;
  hist[0x13] = 0.0;
  hist[0xc] = 0.0;
  hist[0xd] = 0.0;
  hist[0xe] = 0.0;
  hist[0xf] = 0.0;
  hist[8] = 0.0;
  hist[9] = 0.0;
  hist[10] = 0.0;
  hist[0xb] = 0.0;
  hist[4] = 0.0;
  hist[5] = 0.0;
  hist[6] = 0.0;
  hist[7] = 0.0;
  hist[0] = 0.0;
  hist[1] = 0.0;
  hist[2] = 0.0;
  hist[3] = 0.0;
  iVar3 = (x->e_mbd).plane[bVar31].subsampling_x;
  iVar4 = (x->e_mbd).plane[bVar31].subsampling_y;
  uVar12 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  iVar20 = (x->e_mbd).mb_to_right_edge;
  iVar28 = (x->e_mbd).mb_to_bottom_edge;
  bVar9 = (byte)iVar4;
  iVar28 = (int)((iVar28 >> 0x1f & iVar28 >> 3) + (uint)block_size_high[uVar12]) >> (bVar9 & 0x1f);
  bVar10 = (byte)iVar3;
  iVar20 = (int)((iVar20 >> 0x1f & iVar20 >> 3) + (uint)block_size_wide[uVar12]) >> (bVar10 & 0x1f);
  if (x->is_sb_gradient_cached[bVar31] == true) {
    bVar5 = block_size_wide[sb_size] >> (bVar10 & 0x1f);
    pPVar24 = x->pixel_gradient_info +
              (ulong)bVar5 +
              (long)(int)((("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [sb_size] - 1 & (x->e_mbd).mi_col) << (2 - bVar10 & 0x1f)) +
                         (("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [sb_size] - 1 & (x->e_mbd).mi_row) << (2 - bVar9 & 0x1f)) * (uint)bVar5)
              + (ulong)(is_chroma != 0) * 0x4000 + 1;
    fVar33 = 0.1;
    for (lVar25 = 1; lVar30 = 1, lVar25 < iVar28 + -1; lVar25 = lVar25 + 1) {
      for (; lVar30 < iVar20 + -1; lVar30 = lVar30 + 1) {
        uVar1 = pPVar24[lVar30 + -1].abs_dx_abs_dy_sum;
        if (uVar1 != 0) {
          if (pPVar24[lVar30 + -1].is_dx_zero == true) {
            hist[1] = 0.0;
            hist[0] = hist[0] + (float)(uVar1 >> 1);
            pfVar8 = hist + 0x1f;
            fVar32 = (float)(uVar1 >> 1);
          }
          else {
            pfVar8 = hist + pPVar24[lVar30 + -1].hist_bin_idx;
            fVar32 = (float)uVar1;
          }
          fVar33 = fVar33 + (float)uVar1;
          *pfVar8 = fVar32 + *pfVar8;
        }
      }
      pPVar24 = pPVar24 + bVar5;
    }
  }
  else {
    puVar19 = x->plane[bVar31].src.buf;
    lVar25 = (long)x->plane[bVar31].src.stride;
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      puVar29 = puVar19 + lVar25 * 2;
      fVar33 = 0.1;
      puVar27 = puVar19;
      for (iVar16 = 1; puVar19 = puVar19 + lVar25, iVar16 < iVar28 + -1; iVar16 = iVar16 + 1) {
        lVar30 = 1;
        while (lVar26 = lVar30 + 1, lVar30 < iVar20 + -1) {
          iVar7 = (uint)puVar27[lVar26] + (uint)puVar19[lVar26] * 2 + (uint)puVar29[lVar26];
          iVar11 = (uint)puVar27[lVar30 + -1] + (uint)puVar19[lVar30 + -1] * 2 +
                   (uint)puVar29[lVar30 + -1];
          iVar21 = (uint)puVar29[lVar30 + -1] + (uint)puVar29[lVar26] + (uint)puVar29[lVar30] * 2;
          iVar13 = (uint)puVar27[lVar30 + -1] + (uint)puVar27[lVar30] * 2 + (uint)puVar27[lVar26];
          iVar23 = iVar7 - iVar11;
          lVar30 = lVar26;
          if ((iVar23 != 0) || (iVar21 != iVar13)) {
            iVar21 = iVar21 - iVar13;
            iVar13 = -iVar23;
            if (0 < iVar23) {
              iVar13 = iVar23;
            }
            iVar15 = -iVar21;
            if (0 < iVar21) {
              iVar15 = iVar21;
            }
            uVar14 = iVar15 + iVar13;
            if (uVar14 != 0) {
              if (iVar7 == iVar11) {
                hist[0] = hist[0] + (float)(uVar14 >> 1);
                pfVar8 = hist + 0x1f;
                fVar32 = (float)(uVar14 >> 1);
              }
              else {
                iVar21 = get_hist_bin_idx(iVar23,iVar21);
                pfVar8 = hist + iVar21;
                fVar32 = (float)(int)uVar14;
              }
              fVar33 = fVar33 + (float)(int)uVar14;
              *pfVar8 = fVar32 + *pfVar8;
            }
          }
        }
        puVar29 = puVar29 + lVar25;
        puVar27 = puVar27 + lVar25;
      }
    }
    else {
      lVar26 = (long)puVar19 * 2;
      lVar6 = lVar25 * 2;
      lVar30 = (long)puVar19 * 2;
      lVar25 = lVar25 * 4 + (long)puVar19 * 2;
      fVar33 = 0.1;
      for (iVar16 = 1; lVar30 = lVar6 + lVar30, iVar16 < iVar28 + -1; iVar16 = iVar16 + 1) {
        lVar18 = 1;
        while (lVar17 = lVar18 + 1, lVar18 < iVar20 + -1) {
          uVar1 = *(ushort *)(lVar26 + lVar17 * 2);
          uVar14 = (uint)*(ushort *)(lVar25 + lVar17 * 2);
          iVar7 = (uint)uVar1 + (uint)*(ushort *)(lVar30 + lVar17 * 2) * 2 + uVar14;
          uVar2 = *(ushort *)(lVar26 + -4 + lVar17 * 2);
          uVar22 = (uint)*(ushort *)(lVar25 + -4 + lVar17 * 2);
          iVar11 = (uint)uVar2 + (uint)*(ushort *)(lVar30 + -4 + lVar17 * 2) * 2 + uVar22;
          iVar21 = uVar22 + uVar14 + (uint)*(ushort *)(lVar25 + -2 + lVar17 * 2) * 2;
          iVar13 = (uint)uVar2 + (uint)*(ushort *)(lVar26 + -2 + lVar17 * 2) * 2 + (uint)uVar1;
          iVar23 = iVar7 - iVar11;
          lVar18 = lVar17;
          if ((iVar23 != 0) || (iVar21 != iVar13)) {
            iVar21 = iVar21 - iVar13;
            iVar13 = -iVar23;
            if (0 < iVar23) {
              iVar13 = iVar23;
            }
            iVar15 = -iVar21;
            if (0 < iVar21) {
              iVar15 = iVar21;
            }
            uVar14 = iVar15 + iVar13;
            if (uVar14 != 0) {
              if (iVar7 == iVar11) {
                hist[0] = hist[0] + (float)(uVar14 >> 1);
                pfVar8 = hist + 0x1f;
                fVar32 = (float)(uVar14 >> 1);
              }
              else {
                iVar21 = get_hist_bin_idx(iVar23,iVar21);
                pfVar8 = hist + iVar21;
                fVar32 = (float)(int)uVar14;
              }
              fVar33 = fVar33 + (float)(int)uVar14;
              *pfVar8 = fVar32 + *pfVar8;
            }
          }
        }
        lVar26 = lVar26 + lVar6;
        lVar25 = lVar25 + lVar6;
      }
    }
  }
  for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 1) {
    hist[lVar25] = hist[lVar25] / fVar33;
  }
  for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 1) {
    hist[lVar25] = hist[lVar25] * (float)((iVar4 + 1) * (iVar3 + 1));
  }
  scores[4] = 0.0;
  scores[5] = 0.0;
  scores[6] = 0.0;
  scores[7] = 0.0;
  scores[0] = 0.0;
  scores[1] = 0.0;
  scores[2] = 0.0;
  scores[3] = 0.0;
  (*av1_nn_predict)(hist,&av1_intra_hog_model_nnconfig,1,scores);
  for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
    if (scores[lVar25] <= th) {
      directional_mode_skip_mask[lVar25 + 1] = '\x01';
    }
  }
  return;
}

Assistant:

static inline void prune_intra_mode_with_hog(
    const MACROBLOCK *x, BLOCK_SIZE bsize, BLOCK_SIZE sb_size, float th,
    uint8_t *directional_mode_skip_mask, int is_chroma) {
  const int plane = is_chroma ? AOM_PLANE_U : AOM_PLANE_Y;
  float hist[BINS] = { 0.0f };
  collect_hog_data(x, bsize, sb_size, plane, hist);

  // Make prediction for each of the mode
  float scores[DIRECTIONAL_MODES] = { 0.0f };
  av1_nn_predict(hist, &av1_intra_hog_model_nnconfig, 1, scores);
  for (UV_PREDICTION_MODE uv_mode = UV_V_PRED; uv_mode <= UV_D67_PRED;
       uv_mode++) {
    if (scores[uv_mode - UV_V_PRED] <= th) {
      directional_mode_skip_mask[uv_mode] = 1;
    }
  }
}